

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# memory.h
# Opt level: O2

void __thiscall
kj::_::HeapDisposer<kj::(anonymous_namespace)::DiskAppendableFile>::disposeImpl
          (HeapDisposer<kj::(anonymous_namespace)::DiskAppendableFile> *this,void *pointer)

{
  if (pointer != (void *)0x0) {
    anon_unknown_9::DiskAppendableFile::~DiskAppendableFile((DiskAppendableFile *)pointer);
  }
  operator_delete(pointer,0x28);
  return;
}

Assistant:

virtual void disposeImpl(void* pointer) const override { delete reinterpret_cast<T*>(pointer); }